

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cpp
# Opt level: O3

Ptr<Surface> __thiscall
myvk::Surface::Create(Surface *this,Ptr<Instance> *instance,GLFWwindow *window)

{
  VkResult VVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Ptr<Surface> PVar3;
  undefined1 local_39;
  _func_int **local_38;
  element_type *peStack_30;
  
  std::__shared_ptr<myvk::Surface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Surface>>
            ((__shared_ptr<myvk::Surface,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<myvk::Surface> *)&local_39);
  local_38[3] = (_func_int *)
                (instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 4),
             &(instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            );
  local_38[5] = (_func_int *)window;
  VVar1 = glfwCreateWindowSurface
                    (*(VkInstance_conflict *)(local_38[3] + 0x18),window,
                     (VkAllocationCallbacks *)0x0,(VkSurfaceKHR_conflict *)(local_38 + 6));
  _Var2._M_pi = extraout_RDX;
  if (VVar1 == VK_SUCCESS) {
    (this->super_Base)._vptr_Base = local_38;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_30;
  }
  else {
    (this->super_Base)._vptr_Base = (_func_int **)0x0;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    if (peStack_30 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_30);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Surface>)PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Surface> Surface::Create(const Ptr<Instance> &instance, GLFWwindow *window) {
	auto ret = std::make_shared<Surface>();
	ret->m_instance_ptr = instance;
	ret->m_window = window;
	if (glfwCreateWindowSurface(ret->m_instance_ptr->GetHandle(), window, nullptr, &ret->m_surface) != VK_SUCCESS)
		return nullptr;
	return ret;
}